

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs
          (BuildSystemFrontendDelegate *this,Command *command,Node *output,
          ArrayRef<llbuild::buildsystem::BuildKey> inputs)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  raw_ostream *prVar4;
  BuildKey *pBVar5;
  KeyType *this_00;
  string *psVar6;
  void *__ptr;
  size_t __size;
  StringRef local_e8;
  string local_d8;
  ulong local_b8;
  size_t i;
  string local_a0;
  undefined1 local_80 [8];
  raw_string_ostream messageStream;
  string message;
  Node *output_local;
  Command *command_local;
  BuildSystemFrontendDelegate *this_local;
  ArrayRef<llbuild::buildsystem::BuildKey> inputs_local;
  
  inputs_local.Data = (BuildKey *)inputs.Length;
  this_local = (BuildSystemFrontendDelegate *)inputs.Data;
  std::__cxx11::string::string((string *)&messageStream.OS);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_80,(string *)&messageStream.OS);
  llvm::raw_ostream::operator<<((raw_ostream *)local_80,"cannot build \'");
  _i = Node::getName(output);
  llvm::StringRef::str_abi_cxx11_(&local_a0,(StringRef *)&i);
  llvm::raw_ostream::operator<<((raw_ostream *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  llvm::raw_ostream::operator<<((raw_ostream *)local_80,"\' due to missing inputs: ");
  local_b8 = 0;
  while( true ) {
    uVar1 = local_b8;
    sVar3 = llvm::ArrayRef<llbuild::buildsystem::BuildKey>::size
                      ((ArrayRef<llbuild::buildsystem::BuildKey> *)&this_local);
    if (sVar3 <= uVar1) break;
    if (local_b8 != 0) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_80,", ");
    }
    prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)local_80,"\'");
    pBVar5 = llvm::ArrayRef<llbuild::buildsystem::BuildKey>::operator[]
                       ((ArrayRef<llbuild::buildsystem::BuildKey> *)&this_local,local_b8);
    bVar2 = BuildKey::isNode(pBVar5);
    if (bVar2) {
      pBVar5 = llvm::ArrayRef<llbuild::buildsystem::BuildKey>::operator[]
                         ((ArrayRef<llbuild::buildsystem::BuildKey> *)&this_local,local_b8);
      local_e8 = BuildKey::getNodeName(pBVar5);
      llvm::StringRef::str_abi_cxx11_(&local_d8,&local_e8);
    }
    else {
      pBVar5 = llvm::ArrayRef<llbuild::buildsystem::BuildKey>::operator[]
                         ((ArrayRef<llbuild::buildsystem::BuildKey> *)&this_local,local_b8);
      this_00 = BuildKey::getKeyData(pBVar5);
      psVar6 = llbuild::core::KeyType::str_abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)&local_d8,(string *)psVar6);
    }
    prVar4 = llvm::raw_ostream::operator<<(prVar4,&local_d8);
    llvm::raw_ostream::operator<<(prVar4,"\'");
    std::__cxx11::string::~string((string *)&local_d8);
    local_b8 = local_b8 + 1;
  }
  llvm::raw_ostream::flush((raw_ostream *)local_80);
  __ptr = (void *)std::__cxx11::string::data();
  __size = std::__cxx11::string::size();
  fwrite(__ptr,__size,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_80);
  std::__cxx11::string::~string((string *)&messageStream.OS);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandCannotBuildOutputDueToMissingInputs(
     Command * command, Node *output, ArrayRef<BuildKey> inputs) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "cannot build '";
  messageStream << output->getName().str();
  messageStream << "' due to missing inputs: ";

  for (size_t i = 0; i < inputs.size(); ++i) {
    if (i > 0) {
      messageStream << ", ";
    }
    messageStream << "'" << (inputs[i].isNode() ? inputs[i].getNodeName().str() : inputs[i].getKeyData().str()) << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}